

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DoubleDatatypeValidator::setEnumeration
          (DoubleDatatypeValidator *this,MemoryManager *manager)

{
  RefArrayVectorOf<char16_t> *pRVar1;
  XMLSize_t maxElems;
  DatatypeValidator *pDVar2;
  char16_t *pcVar3;
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *pBVar4;
  XMLDouble *this_00;
  XMLSize_t XVar5;
  
  pRVar1 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
           fStrEnumeration;
  if (pRVar1 != (RefArrayVectorOf<char16_t> *)0x0) {
    maxElems = (pRVar1->super_BaseRefVectorOf<char16_t>).fCurCount;
    pDVar2 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
             super_DatatypeValidator.fBaseValidator;
    if (maxElems != 0 && pDVar2 != (DatatypeValidator *)0x0) {
      XVar5 = 0;
      do {
        pcVar3 = BaseRefVectorOf<char16_t>::elementAt
                           (&((this->super_AbstractNumericValidator).
                              super_AbstractNumericFacetValidator.fStrEnumeration)->
                             super_BaseRefVectorOf<char16_t>,XVar5);
        (*(pDVar2->super_XSerializable)._vptr_XSerializable[0x11])(pDVar2,pcVar3,0,0,manager);
        XVar5 = XVar5 + 1;
      } while (maxElems != XVar5);
    }
    pBVar4 = (BaseRefVectorOf<xercesc_4_0::XMLNumber> *)XMemory::operator_new(0x30,manager);
    BaseRefVectorOf<xercesc_4_0::XMLNumber>::BaseRefVectorOf(pBVar4,maxElems,true,manager);
    pBVar4->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409cf8;
    (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumeration =
         (RefVectorOf<xercesc_4_0::XMLNumber> *)pBVar4;
    (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumerationInherited
         = false;
    if (maxElems != 0) {
      XVar5 = 0;
      do {
        pBVar4 = &((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                  fEnumeration)->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
        this_00 = (XMLDouble *)XMemory::operator_new(0x38,manager);
        pcVar3 = BaseRefVectorOf<char16_t>::elementAt
                           (&((this->super_AbstractNumericValidator).
                              super_AbstractNumericFacetValidator.fStrEnumeration)->
                             super_BaseRefVectorOf<char16_t>,XVar5);
        XMLDouble::XMLDouble(this_00,pcVar3,manager);
        BaseRefVectorOf<xercesc_4_0::XMLNumber>::insertElementAt(pBVar4,(XMLNumber *)this_00,XVar5);
        XVar5 = XVar5 + 1;
      } while (maxElems != XVar5);
    }
  }
  return;
}

Assistant:

void  DoubleDatatypeValidator::setEnumeration(MemoryManager* const manager)
{
    // check 4.3.5.c0 must: enumeration values from the value space of base
    //
    // 1. shall be from base value space
    // 2. shall be from current value space as well ( shall go through boundsCheck() )
    //
    if (!fStrEnumeration)
        return;

    XMLSize_t i = 0;
    XMLSize_t enumLength = fStrEnumeration->size();

    DoubleDatatypeValidator *numBase = (DoubleDatatypeValidator*) getBaseValidator();
    if (numBase)
    {
        try
        {
            for ( i = 0; i < enumLength; i++)
            {
                numBase->checkContent(fStrEnumeration->elementAt(i), (ValidationContext*)0, false, manager);
            }
        }
        catch (XMLException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_enum_base
                    , fStrEnumeration->elementAt(i)
                    , manager);

        }
    }

#if 0
// spec says that only base has to checkContent          
    // We put the this->checkContent in a separate loop
    // to not block original message with in that method.
    //
    for ( i = 0; i < enumLength; i++)
    {
        checkContent(fStrEnumeration->elementAt(i), (ValidationContext*)0, false, manager);
    }
#endif

    fEnumeration = new (manager) RefVectorOf<XMLNumber>(enumLength, true, manager);
    fEnumerationInherited = false;

    for ( i = 0; i < enumLength; i++)
    {
        fEnumeration->insertElementAt(new (manager) XMLDouble(fStrEnumeration->elementAt(i), manager), i);
    }
}